

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LFSR.hpp
# Opt level: O0

void __thiscall Numeric::LFSR<unsigned_int,_73728U>::LFSR(LFSR<unsigned_int,_73728U> *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong local_20;
  size_t c;
  uint8_t *value_byte;
  LFSR<unsigned_int,_73728U> *this_local;
  
  this->value_ = 0;
  while (this->value_ == 0) {
    c = (size_t)this;
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      iVar2 = rand();
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar2 * 0x7f;
      *(char *)c = SUB161(auVar1 / ZEXT816(0x7fffffff),0);
      c = c + 1;
    }
  }
  return;
}

Assistant:

constexpr LFSR() noexcept {
			// Randomise the value, ensuring it doesn't end up being 0;
			// don't set any top bits, in case this is a signed type.
			while(!value_) {
				uint8_t *value_byte = reinterpret_cast<uint8_t *>(&value_);
				for(size_t c = 0; c < sizeof(IntType); ++c) {
					*value_byte = uint8_t(uint64_t(rand()) * 127 / RAND_MAX);
					++value_byte;
				}
			}
		}